

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_indexOfMax(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  vm_val_t *self;
  vm_val_t *in_RCX;
  vm_val_t *in_RDX;
  undefined8 in_RSI;
  unsigned_short method_idx;
  int unaff_retaddr;
  vm_rcdesc rc;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  vm_datatype_t vVar2;
  char *in_stack_ffffffffffffff98;
  vm_rcdesc *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffc4;
  vm_rcdesc *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  method_idx = (unsigned_short)((ulong)in_RSI >> 0x30);
  self = CVmStack::get(0);
  if (in_RCX == (vm_val_t *)0x0) {
    vVar2 = 0;
  }
  else {
    vVar2 = in_RCX->typ;
  }
  vm_rcdesc::vm_rcdesc
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,self,method_idx,
             (vm_val_t *)CONCAT44(vVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c);
  iVar1 = get_minmax(in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,unaff_retaddr);
  return iVar1;
}

Assistant:

int CVmObjList::getp_indexOfMax(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.indexOfMax", self_val, 31, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, TRUE);
}